

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

stumpless_entry * stumpless_set_entry_message_str(stumpless_entry *entry,char *message)

{
  char *__ptr;
  char *pcVar1;
  size_t new_message_length;
  size_t local_20;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
LAB_0010c608:
    entry = (stumpless_entry *)0x0;
  }
  else {
    if (message == (char *)0x0) {
      local_20 = 0;
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = copy_cstring_with_length(message,&local_20);
      if (pcVar1 == (char *)0x0) goto LAB_0010c608;
    }
    lock_entry(entry);
    __ptr = entry->message;
    entry->message = pcVar1;
    entry->message_length = local_20;
    unlock_entry(entry);
    free_mem(__ptr);
    clear_error();
  }
  return entry;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_message_str( struct stumpless_entry *entry,
                                 const char *message ) {
  char *new_message;
  size_t new_message_length;
  const char *old_message;

  VALIDATE_ARG_NOT_NULL( entry );

  if( message ) {
    new_message = copy_cstring_with_length( message, &new_message_length );
    if( !new_message ) {
      return NULL;
    }
  } else {
    new_message = NULL;
    new_message_length = 0;
  }

  lock_entry( entry );
  old_message = entry->message;
  entry->message = new_message;
  entry->message_length = new_message_length;
  unlock_entry( entry );

  free_mem( old_message );
  clear_error(  );

  return entry;
}